

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall adios2sys::CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  CommandLineArgumentsInternal *this_00;
  
  this_00 = this->Internals;
  if (this_00 != (CommandLineArgumentsInternal *)0x0) {
    CommandLineArgumentsInternal::~CommandLineArgumentsInternal(this_00);
  }
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&this->Help);
  return;
}

Assistant:

CommandLineArguments::~CommandLineArguments()
{
  delete this->Internals;
}